

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv__signal_unlock(void)

{
  long lVar1;
  int iVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  int *piVar4;
  char data;
  int r;
  undefined8 uStack_8;
  
  uStack_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_8._0_3_ = (uint3)in_RAX;
  uStack_8._0_4_ = CONCAT13(0x2a,(uint3)uStack_8);
  do {
    sVar3 = write(uv__signal_lock_pipefd[1],(void *)((long)&uStack_8 + 3),1);
    lVar1 = uStack_8;
    uStack_8 = CONCAT44((int)sVar3,(undefined4)uStack_8);
    uStack_8._0_2_ = (ushort)lVar1;
    uStack_8._0_3_ = (uint3)(ushort)uStack_8;
    if ((int)sVar3 < 0) {
      piVar4 = __errno_location();
      uStack_8._0_3_ = CONCAT12(*piVar4 == 4,(ushort)uStack_8);
    }
  } while (uStack_8._2_1_ != '\0');
  iVar2 = 0;
  if (uStack_8 < 0) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int uv__signal_unlock(void) {
  int r;
  char data = 42;

  do {
    r = write(uv__signal_lock_pipefd[1], &data, sizeof data);
  } while (r < 0 && errno == EINTR);

  return (r < 0) ? -1 : 0;
}